

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void begin_burn(level *lev,obj *obj,boolean already_lit)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  boolean bVar5;
  int iVar6;
  undefined8 in_RAX;
  uint uVar7;
  long when;
  xchar y;
  xchar x;
  undefined2 local_32;
  undefined2 uVar8;
  
  uVar8 = (undefined2)((ulong)in_RAX >> 0x38);
  if (((obj->age == 0) && (obj->otyp != 0xe9)) && (bVar5 = artifact_light(obj), bVar5 == '\0')) {
    return;
  }
  uVar7 = (ushort)obj->otyp - 0xe5;
  uVar4 = (ulong)uVar7;
  if (uVar7 < 0x27) {
    if ((0x4000000003U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0xcUL >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 4) goto LAB_0025cb1a;
        goto LAB_0025cb0b;
      }
      iVar6 = obj->age;
      when = (long)iVar6;
      if (when < 0x97) {
        if (iVar6 < 0x65) {
          if (iVar6 < 0x33) {
            if (0x19 < iVar6) {
              when = when + -0x19;
            }
          }
          else {
            when = when + -0x32;
          }
        }
        else {
          when = when + -100;
        }
      }
      else {
        when = when + -0x96;
      }
      iVar6 = 3;
    }
    else {
      lVar2 = (long)obj->age;
      when = lVar2 + -0xf;
      if (lVar2 < 0x10) {
        when = lVar2;
      }
      if (0x4b < lVar2) {
        when = lVar2 + -0x4b;
      }
      iVar6 = candle_light_range(obj);
    }
  }
  else {
LAB_0025cb1a:
    if (obj->otyp != 0x142) {
      bVar5 = artifact_light(obj);
      if (bVar5 == '\0') {
        if (((0x15 < (ushort)(obj->otyp - 0x54U)) ||
            (obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr == (char *)0x0)) ||
           (iVar6 = strncmp(obj_descr[objects[(ushort)obj->otyp].oc_descr_idx].oc_descr,"gold ",5),
           iVar6 != 0)) {
          pcVar3 = xname(obj);
          bVar1 = false;
          warning("begin burn: unexpected %s",pcVar3);
          when = (long)obj->age;
          iVar6 = 3;
          goto LAB_0025cc00;
        }
LAB_0025cb0b:
        obj->field_0x4c = obj->field_0x4c | 8;
        iVar6 = 3;
      }
      else {
        obj->field_0x4c = obj->field_0x4c | 8;
        iVar6 = 2;
      }
      bVar1 = true;
      when = 0;
      goto LAB_0025cc00;
    }
    when = (long)obj->age;
    iVar6 = 1;
  }
  bVar1 = false;
LAB_0025cc00:
  if (!bVar1) {
    start_timer(obj->olev,when,2,3,obj);
    obj->field_0x4c = obj->field_0x4c | 8;
    obj->age = obj->age - (int)when;
  }
  if ((already_lit == '\0') && (obj->where == '\x03')) {
    update_inventory();
  }
  if ((already_lit == '\0') && ((*(uint *)&obj->field_0x4a & 0x80000) != 0)) {
    local_32 = uVar8;
    bVar5 = get_obj_location(obj,(xchar *)((long)&local_32 + 1),(xchar *)&local_32,3);
    if (bVar5 == '\0') {
      warning("begin_burn: can\'t get obj position");
    }
    else {
      new_light_source(lev,local_32._1_1_,(xchar)local_32,iVar6,0,obj);
    }
  }
  return;
}

Assistant:

void begin_burn(struct level *lev, struct obj *obj, boolean already_lit)
{
	int radius = 3;
	long turns = 0;
	boolean do_timer = TRUE;

	if (obj->age == 0 && obj->otyp != MAGIC_LAMP && !artifact_light(obj))
	    return;

	switch (obj->otyp) {
	    case MAGIC_LAMP:
		obj->lamplit = 1;
		do_timer = FALSE;
		break;

	    case POT_OIL:
		turns = obj->age;
		radius = 1;	/* very dim light */
		break;

	    case BRASS_LANTERN:
	    case OIL_LAMP:
		/* magic times are 150, 100, 50, 25, and 0 */
		if (obj->age > 150L)
		    turns = obj->age - 150L;
		else if (obj->age > 100L)
		    turns = obj->age - 100L;
		else if (obj->age > 50L)
		    turns = obj->age - 50L;
		else if (obj->age > 25L)
		    turns = obj->age - 25L;
		else
		    turns = obj->age;
		break;

	    case CANDELABRUM_OF_INVOCATION:
	    case TALLOW_CANDLE:
	    case WAX_CANDLE:
		/* magic times are 75, 15, and 0 */
		if (obj->age > 75L)
		    turns = obj->age - 75L;
		else if (obj->age > 15L)
		    turns = obj->age - 15L;
		else
		    turns = obj->age;
		radius = candle_light_range(obj);
		break;

	    default:
                /* [ALI] Support artifact light sources */
                if (artifact_light(obj)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		    radius = 2;
		} else if (Is_gold_dragon_armor(obj->otyp)) {
		    obj->lamplit = 1;
		    do_timer = FALSE;
		} else {
		    warning("begin burn: unexpected %s", xname(obj));
		    turns = obj->age;
		}
		break;
	}

	if (do_timer) {
	    if (start_timer(obj->olev, turns, TIMER_OBJECT,
					BURN_OBJECT, obj)) {
		obj->lamplit = 1;
		obj->age -= turns;
		if (carried(obj) && !already_lit)
		    update_inventory();
	    } else {
		obj->lamplit = 0;
	    }
	} else {
	    if (carried(obj) && !already_lit)
		update_inventory();
	}

	if (obj->lamplit && !already_lit) {
	    xchar x, y;

	    if (get_obj_location(obj, &x, &y, CONTAINED_TOO|BURIED_TOO))
		new_light_source(lev, x, y, radius, LS_OBJECT, obj);
	    else
		warning("begin_burn: can't get obj position");
	}
}